

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::
InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>_>
::clear(InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>_>
        *this)

{
  bool bVar1;
  Allocation *this_00;
  allocator_type *a;
  pointer pQVar2;
  pointer pQVar3;
  Tag *pTVar4;
  Tag local_20;
  size_type local_18;
  size_type s;
  InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>_>
  *this_local;
  
  s = (size_type)this;
  local_18 = size(this);
  bVar1 = allocated(this);
  if (bVar1) {
    pQVar2 = allocated_space(this);
    pQVar3 = allocated_space(this);
    Destroy(this,pQVar2,pQVar3 + local_18);
    this_00 = allocation(this);
    a = allocator(this);
    Allocation::Dealloc(this_00,a);
  }
  else if (local_18 != 0) {
    pQVar2 = inlined_space(this);
    pQVar3 = inlined_space(this);
    Destroy(this,pQVar2,pQVar3 + local_18);
  }
  Tag::Tag(&local_20);
  pTVar4 = tag(this);
  pTVar4->size_ = local_20.size_;
  return;
}

Assistant:

void clear() noexcept {
    size_type s = size();
    if (allocated()) {
      Destroy(allocated_space(), allocated_space() + s);
      allocation().Dealloc(allocator());
    } else if (s != 0) {  // do nothing for empty vectors
      Destroy(inlined_space(), inlined_space() + s);
    }
    tag() = Tag();
  }